

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int execute_filter_audio(rar_filter *filter,rar_virtual_machine *vm)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte local_8e;
  byte local_8d;
  uint8_t idx;
  uint8_t k;
  int prederror;
  uint8_t byte;
  uint8_t predbyte;
  int8_t delta;
  audio_state state;
  uint32_t j;
  uint32_t i;
  uint8_t *dst;
  uint8_t *src;
  uint32_t numchannels;
  uint32_t length;
  rar_virtual_machine *vm_local;
  rar_filter *filter_local;
  
  uVar2 = filter->initialregisters[4];
  uVar3 = filter->initialregisters[0];
  if (uVar2 < 0x1e001) {
    dst = vm->memory;
    state.lastbyte = '\0';
    state._65_3_ = 0;
    for (; (uint)state._64_4_ < uVar3; state._64_4_ = state._64_4_ + 1) {
      memset(&prederror,0,0x44);
      for (state.count = state._64_4_; (uint)state.count < uVar2; state.count = uVar3 + state.count)
      {
        if (vm->memory + uVar2 <= dst) {
          return 0;
        }
        uVar1 = *dst;
        state.weight[2] = state.weight[0];
        state.weight[3] = state.weight[1];
        sVar5 = (char)state.delta[0] - _predbyte;
        _predbyte = (short)(char)state.delta[0];
        bVar4 = (char)((int)((uint)(byte)state.error[10] * 8 + (int)(char)prederror * (int)_predbyte
                             + (int)prederror._1_1_ * (int)sVar5 +
                            (int)prederror._2_1_ * (int)(short)state.weight._0_2_) >> 3) - uVar1;
        iVar6 = (char)uVar1 * 8;
        iVar8 = iVar6;
        if (iVar6 < 1) {
          iVar8 = (char)uVar1 * -8;
        }
        iVar7 = iVar6 - _predbyte;
        if (iVar7 < 1) {
          iVar7 = -iVar7;
        }
        state._12_4_ = iVar7 + state._12_4_;
        state.delta._2_4_ = iVar8 + state.delta._2_4_;
        iVar8 = iVar6 + _predbyte;
        if (iVar8 < 1) {
          iVar8 = -iVar8;
        }
        iVar7 = iVar6 - sVar5;
        if (iVar7 < 1) {
          iVar7 = -iVar7;
        }
        state.error[1] = iVar7 + state.error[1];
        state.error[0] = iVar8 + state.error[0];
        iVar8 = iVar6 + sVar5;
        if (iVar8 < 1) {
          iVar8 = -iVar8;
        }
        iVar7 = iVar6 - (short)state.weight._0_2_;
        if (iVar7 < 1) {
          iVar7 = -iVar7;
        }
        state.error[3] = iVar7 + state.error[3];
        state.error[2] = iVar8 + state.error[2];
        iVar6 = iVar6 + (short)state.weight._0_2_;
        if (iVar6 < 1) {
          iVar6 = -iVar6;
        }
        state.error[4] = iVar6 + state.error[4];
        state.delta[0]._0_1_ = bVar4 - (byte)state.error[10];
        (vm->memory + uVar2)[(uint)state.count] = bVar4;
        if ((state.error[9] & 0x1fU) == 0) {
          local_8e = 0;
          for (local_8d = 1; local_8d < 7; local_8d = local_8d + 1) {
            if (state.error[(ulong)local_8d - 2] < state.error[(ulong)local_8e - 2]) {
              local_8e = local_8d;
            }
          }
          state.error[6] = 0;
          state.error[7] = 0;
          state.error[8] = 0;
          state.error[2] = 0;
          state.error[3] = 0;
          state.error[4] = 0;
          state.error[5] = 0;
          state.delta[1] = 0;
          state.delta[2] = 0;
          state.delta[3] = 0;
          state.lastdelta = '\0';
          state._15_1_ = 0;
          state.error[0] = 0;
          state.error[1] = 0;
          switch(local_8e) {
          case 1:
            if (-0x11 < (char)prederror) {
              prederror._0_1_ = (char)prederror + -1;
            }
            break;
          case 2:
            if ((char)prederror < '\x10') {
              prederror._0_1_ = (char)prederror + '\x01';
            }
            break;
          case 3:
            if (-0x11 < prederror._1_1_) {
              prederror._1_1_ = prederror._1_1_ + -1;
            }
            break;
          case 4:
            if (prederror._1_1_ < '\x10') {
              prederror._1_1_ = prederror._1_1_ + '\x01';
            }
            break;
          case 5:
            if (-0x11 < prederror._2_1_) {
              prederror._2_1_ = prederror._2_1_ + -1;
            }
            break;
          case 6:
            if (prederror._2_1_ < '\x10') {
              prederror._2_1_ = prederror._2_1_ + '\x01';
            }
          }
        }
        state.weight._0_2_ = sVar5;
        state.error[9] = state.error[9] + 1;
        state.error[10]._0_1_ = bVar4;
        dst = dst + 1;
      }
    }
    filter->filteredblockaddress = uVar2;
    filter->filteredblocklength = uVar2;
    filter_local._4_4_ = 1;
  }
  else {
    filter_local._4_4_ = 0;
  }
  return filter_local._4_4_;
}

Assistant:

static int
execute_filter_audio(struct rar_filter *filter, struct rar_virtual_machine *vm)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t numchannels = filter->initialregisters[0];
  uint8_t *src, *dst;
  uint32_t i, j;

  if (length > PROGRAM_WORK_SIZE / 2)
    return 0;

  src = &vm->memory[0];
  dst = &vm->memory[length];
  for (i = 0; i < numchannels; i++)
  {
    struct audio_state state;
    memset(&state, 0, sizeof(state));
    for (j = i; j < length; j += numchannels)
    {
      /*
       * The src block should not overlap with the dst block.
       * If so it would be better to consider this archive is broken.
       */
      if (src >= dst)
        return 0;

      int8_t delta = (int8_t)*src++;
      uint8_t predbyte, byte;
      int prederror;
      state.delta[2] = state.delta[1];
      state.delta[1] = state.lastdelta - state.delta[0];
      state.delta[0] = state.lastdelta;
      predbyte = ((8 * state.lastbyte + state.weight[0] * state.delta[0] + state.weight[1] * state.delta[1] + state.weight[2] * state.delta[2]) >> 3) & 0xFF;
      byte = (predbyte - delta) & 0xFF;
      prederror = delta << 3;
      state.error[0] += abs(prederror);
      state.error[1] += abs(prederror - state.delta[0]); state.error[2] += abs(prederror + state.delta[0]);
      state.error[3] += abs(prederror - state.delta[1]); state.error[4] += abs(prederror + state.delta[1]);
      state.error[5] += abs(prederror - state.delta[2]); state.error[6] += abs(prederror + state.delta[2]);
      state.lastdelta = (int8_t)(byte - state.lastbyte);
      dst[j] = state.lastbyte = byte;
      if (!(state.count++ & 0x1F))
      {
        uint8_t k, idx = 0;
        for (k = 1; k < 7; k++)
        {
          if (state.error[k] < state.error[idx])
            idx = k;
        }
        memset(state.error, 0, sizeof(state.error));
        switch (idx)
        {
          case 1: if (state.weight[0] >= -16) state.weight[0]--; break;
          case 2: if (state.weight[0] < 16) state.weight[0]++; break;
          case 3: if (state.weight[1] >= -16) state.weight[1]--; break;
          case 4: if (state.weight[1] < 16) state.weight[1]++; break;
          case 5: if (state.weight[2] >= -16) state.weight[2]--; break;
          case 6: if (state.weight[2] < 16) state.weight[2]++; break;
        }
      }
    }
  }

  filter->filteredblockaddress = length;
  filter->filteredblocklength = length;

  return 1;
}